

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray_my.h
# Opt level: O0

uint32_t __thiscall PackedArray_my<17U,_2048U>::get(PackedArray_my<17U,_2048U> *this,uint offset)

{
  uint uVar1;
  uint uVar2;
  sbyte sVar3;
  uint64_t *x;
  uint start_bit;
  uint cell;
  uint offset_local;
  PackedArray_my<17U,_2048U> *this_local;
  
  uVar1 = offset * 0x11 >> 5;
  uVar2 = offset * 0x11 & 0x1f;
  sVar3 = (sbyte)uVar2;
  if (uVar2 < 0x10) {
    this_local._4_4_ = this->mask & this->buf[uVar1] >> sVar3;
  }
  else {
    this_local._4_4_ = this->mask & (uint)(*(ulong *)(this->buf + uVar1) >> sVar3);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t get(unsigned offset) {
        unsigned cell = offset*bits / 32;
        unsigned start_bit = (offset*bits) % 32;
        if(start_bit <= (32 - bits) ) {
            return mask & (buf[cell] >> start_bit);
        } else {
            uint64_t &x = (uint64_t&)buf[cell];
            return mask & (x >> start_bit);
        }
    }